

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Node * __thiscall JSON::Parser::parseNode(Node *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  int iVar2;
  bool bVar3;
  string *psVar4;
  string tokenValue;
  allocator local_269;
  string local_268 [32];
  string local_248;
  string local_228;
  Node local_208;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->type)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->type).field_2
  ;
  (__return_storage_ptr__->type)._M_string_length = 0;
  (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->rawValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->rawValue).field_2;
  (__return_storage_ptr__->rawValue)._M_string_length = 0;
  (__return_storage_ptr__->rawValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  TVar1 = (this->currentToken).type;
  iVar2 = (this->currentToken).start;
  if (TVar1 == STRING) {
    std::__cxx11::string::string((string *)&local_48,(string *)NodeType::StringLiteral_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_68,(string *)&(this->currentToken).value);
    Node::Node(&local_208,&local_48,&local_68,(this->currentToken).start,(this->currentToken).end);
    Node::operator=(__return_storage_ptr__,&local_208);
    Node::~Node(&local_208);
    std::__cxx11::string::~string((string *)&local_68);
    psVar4 = &local_48;
  }
  else {
    if (TVar1 != NUMBER) {
      if (TVar1 == WORD) {
        std::__cxx11::string::string(local_268,(string *)&(this->currentToken).value);
        std::__cxx11::string::string((string *)&local_c8,local_268);
        std::__cxx11::string::string((string *)&local_e8,"null",(allocator *)&local_208);
        bVar3 = stringEquals(&local_c8,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_c8);
        if (bVar3) {
          std::__cxx11::string::string
                    ((string *)&local_108,(string *)NodeType::NullLiteral_abi_cxx11_);
          std::__cxx11::string::string((string *)&local_128,local_268);
          Node::Node(&local_208,&local_108,&local_128,(this->currentToken).start,
                     (this->currentToken).end);
          Node::operator=(__return_storage_ptr__,&local_208);
          Node::~Node(&local_208);
          std::__cxx11::string::~string((string *)&local_128);
          psVar4 = &local_108;
        }
        else {
          std::__cxx11::string::string((string *)&local_228,local_268);
          std::__cxx11::string::string((string *)&local_248,"true",(allocator *)&local_208);
          bVar3 = stringEquals(&local_228,&local_248);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_228);
          }
          else {
            std::__cxx11::string::string((string *)&local_148,local_268);
            std::__cxx11::string::string((string *)&local_168,"false",&local_269);
            bVar3 = stringEquals(&local_148,&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_228);
            if (!bVar3) {
              unexpected(this,&this->currentToken);
            }
          }
          std::__cxx11::string::string
                    ((string *)&local_188,(string *)NodeType::BooleanLiteral_abi_cxx11_);
          std::__cxx11::string::string((string *)&local_1a8,local_268);
          Node::Node(&local_208,&local_188,&local_1a8,(this->currentToken).start,
                     (this->currentToken).end);
          Node::operator=(__return_storage_ptr__,&local_208);
          Node::~Node(&local_208);
          std::__cxx11::string::~string((string *)&local_1a8);
          psVar4 = &local_188;
        }
        std::__cxx11::string::~string((string *)psVar4);
        next(this);
        std::__cxx11::string::~string(local_268);
      }
      else {
        if (TVar1 == BRACKETS_START) {
          parseArrayExpression(&local_208,this);
        }
        else {
          if (TVar1 != BRACES_START) {
            unexpected(this,&this->currentToken);
          }
          parseObjectExpression(&local_208,this);
        }
        Node::operator=(__return_storage_ptr__,&local_208);
        Node::~Node(&local_208);
      }
      goto LAB_001039f0;
    }
    std::__cxx11::string::string((string *)&local_88,(string *)NodeType::NumericLiteral_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_a8,(string *)&(this->currentToken).value);
    Node::Node(&local_208,&local_88,&local_a8,(this->currentToken).start,(this->currentToken).end);
    Node::operator=(__return_storage_ptr__,&local_208);
    Node::~Node(&local_208);
    std::__cxx11::string::~string((string *)&local_a8);
    psVar4 = &local_88;
  }
  std::__cxx11::string::~string((string *)psVar4);
  next(this);
LAB_001039f0:
  __return_storage_ptr__->start = iVar2;
  __return_storage_ptr__->end = (this->lastToken).end;
  return __return_storage_ptr__;
}

Assistant:

Node Parser::parseNode() {
        Node node;
        int startPos = currentToken.start;
        TokenType type = currentToken.type;

        if (type == BRACES_START) {
            node = parseObjectExpression();
        } else if (type == BRACKETS_START) {
            node = parseArrayExpression();
        } else if (type == STRING) {
            node = Node(NodeType::StringLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == NUMBER) {
            node = Node(NodeType::NumericLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == WORD) {
            string tokenValue = currentToken.value;
            if (stringEquals(tokenValue, "null")) {
                node = Node(NodeType::NullLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else if (stringEquals(tokenValue, "true") || stringEquals(tokenValue, "false")) {
                node = Node(NodeType::BooleanLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else {
                unexpected(currentToken);
            }
        } else {
            unexpected(currentToken);
        }

        node.start = startPos;
        node.end = lastToken.end;

        return node;
    }